

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmatch.cpp
# Opt level: O0

bool __thiscall Lmatch::getMatch(Lmatch *this,Pattern *pg,Graph *dg,Graph *dest)

{
  allocator<bool> *this_00;
  _Bit_pointer *this_01;
  value_type_conflict vVar1;
  undefined8 uVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  reference ppVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  reference piVar12;
  reference pvVar13;
  ostream *poVar14;
  reference rVar15;
  Node local_390;
  Node local_350;
  reference local_310;
  int local_300;
  undefined4 local_2fc;
  int j_2;
  reference local_2b8;
  int local_2a4;
  string local_2a0 [4];
  int i_5;
  string local_280 [32];
  string local_260 [32];
  reference local_240;
  undefined1 local_230 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> q;
  iterator __end4;
  iterator __begin4;
  value_type *__range4;
  undefined1 local_1e8 [4];
  int j_1;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p_1;
  iterator __end2_1;
  iterator __begin2_1;
  value_type *__range2_1;
  int i_4;
  int i_3;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  reference local_178;
  value_type_conflict local_164;
  int local_160;
  int j;
  int i_2;
  int i_1;
  _Bit_type local_150;
  undefined1 local_148 [8];
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> p;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int i;
  undefined1 local_d8 [8];
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  edgeMatch;
  undefined1 local_b8 [8];
  vector<bool,_std::allocator<bool>_> nodeMatch;
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  undefined1 local_50 [8];
  Kmatrix km;
  Graph *dest_local;
  Graph *dg_local;
  Pattern *pg_local;
  Lmatch *this_local;
  
  km._24_8_ = dest;
  Kmatrix::Kmatrix((Kmatrix *)local_50);
  iVar5 = Pattern::getT(pg);
  Kmatrix::calMatrix((Kmatrix *)local_50,&pg->super_Graph,dg,iVar5);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)
             &nodeMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage);
  iVar5 = Graph::nodeNum(&pg->super_Graph);
  edgeMatch.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  this_00 = (allocator<bool> *)
            ((long)&edgeMatch.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 6);
  std::allocator<bool>::allocator(this_00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_b8,(long)iVar5,
             (bool *)((long)&edgeMatch.
                             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),this_00);
  std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&edgeMatch.
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  iVar5 = Graph::nodeNum(&pg->super_Graph);
  iVar6 = Graph::nodeNum(&pg->super_Graph);
  __range2._7_1_ = 1;
  std::allocator<bool>::allocator((allocator<bool> *)((long)&__range2 + 6));
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&i,(long)iVar6,(bool *)((long)&__range2 + 7),
             (allocator<bool> *)((long)&__range2 + 6));
  std::allocator<std::vector<bool,_std::allocator<bool>_>_>::allocator
            ((allocator<std::vector<bool,_std::allocator<bool>_>_> *)((long)&__range2 + 5));
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)local_d8,(long)iVar5,(value_type *)&i,
           (allocator<std::vector<bool,_std::allocator<bool>_>_> *)((long)&__range2 + 5));
  std::allocator<std::vector<bool,_std::allocator<bool>_>_>::~allocator
            ((allocator<std::vector<bool,_std::allocator<bool>_>_> *)((long)&__range2 + 5));
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i);
  std::allocator<bool>::~allocator((allocator<bool> *)((long)&__range2 + 6));
  __range2._0_4_ = 0;
  while( true ) {
    iVar5 = (int)__range2;
    iVar6 = Graph::nodeNum(&pg->super_Graph);
    if (iVar6 <= iVar5) break;
    pvVar7 = std::
             vector<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&(pg->super_Graph).edges,(long)(int)__range2);
    __end2 = std::
             set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(pvVar7);
    p._32_8_ = std::
               set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(pvVar7);
    while( true ) {
      bVar3 = std::operator!=(&__end2,(_Self *)&p.field_0x20);
      if (!bVar3) break;
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_148,ppVar8);
      pvVar9 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             *)local_d8,(long)(int)__range2);
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (pvVar9,(long)(int)local_148._0_4_);
      _i_2 = rVar15;
      std::_Bit_reference::operator=((_Bit_reference *)&i_2,false);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_148);
      std::
      _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    __range2._0_4_ = (int)__range2 + 1;
  }
  j = 0;
  while( true ) {
    iVar5 = j;
    iVar6 = Graph::nodeNum(&pg->super_Graph);
    if (iVar6 <= iVar5) break;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&pg->weight,(long)j);
    if (*pvVar10 == -1) {
      iVar5 = Pattern::getT(pg);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&pg->weight,(long)j);
      *pvVar10 = iVar5 + 1;
    }
    j = j + 1;
  }
  local_160 = 0;
  while( true ) {
    iVar5 = local_160;
    iVar6 = Graph::nodeNum(&pg->super_Graph);
    if (iVar6 <= iVar5) break;
    local_164 = 0;
    while( true ) {
      vVar1 = local_164;
      iVar5 = Graph::nodeNum(dg);
      if (iVar5 <= vVar1) break;
      pvVar11 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)local_50,(long)local_160);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)local_164);
      iVar5 = *pvVar10;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&pg->weight,(long)local_160);
      if (*pvVar10 <= iVar5) {
        rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_b8,(long)local_160);
        local_178 = rVar15;
        std::_Bit_reference::operator=(&local_178,true);
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   &nodeMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,&local_164);
      }
      local_164 = local_164 + 1;
    }
    local_160 = local_160 + 1;
  }
  this_01 = &nodeMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_end_of_storage;
  __end1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)this_01);
  _i_4 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)this_01);
  while( true ) {
    bVar3 = std::operator!=(&__end1,(_Self *)&i_4);
    if (!bVar3) break;
    piVar12 = std::_Rb_tree_const_iterator<int>::operator*(&__end1);
    uVar2 = km._24_8_;
    pvVar13 = std::vector<Node,_std::allocator<Node>_>::operator[](&dg->nodes,(long)*piVar12);
    Graph::insertNode((Graph *)uVar2,pvVar13);
    std::_Rb_tree_const_iterator<int>::operator++(&__end1);
  }
  __range2_1._0_4_ = 0;
  while( true ) {
    iVar5 = Graph::nodeNum(&pg->super_Graph);
    if (iVar5 <= (int)__range2_1) break;
    pvVar7 = std::
             vector<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::operator[](&(pg->super_Graph).edges,(long)(int)__range2_1);
    __end2_1 = std::
               set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::begin(pvVar7);
    p_1._32_8_ = std::
                 set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end(pvVar7);
    while( true ) {
      bVar3 = std::operator!=(&__end2_1,(_Self *)&p_1.field_0x20);
      if (!bVar3) break;
      ppVar8 = std::
               _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2_1);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_1e8,ppVar8);
      __range4._4_4_ = 0;
      while( true ) {
        iVar5 = Graph::nodeNum(dg);
        if (iVar5 <= __range4._4_4_) break;
        pvVar7 = std::
                 vector<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 ::operator[](&dg->edges,(long)__range4._4_4_);
        __end4 = std::
                 set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(pvVar7);
        q._32_8_ = std::
                   set<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end(pvVar7);
        while( true ) {
          bVar3 = std::operator!=(&__end4,(_Self *)&q.field_0x20);
          if (!bVar3) break;
          ppVar8 = std::
                   _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&__end4);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_230,ppVar8);
          pvVar11 = std::
                    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  *)local_50,(long)(int)__range2_1);
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar11,(long)__range4._4_4_)
          ;
          iVar5 = *pvVar10;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pg->weight,(long)(int)__range2_1);
          if (*pvVar10 <= iVar5) {
            pvVar11 = std::
                      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    *)local_50,(long)(int)local_1e8);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (pvVar11,(long)(int)local_230._0_4_);
            iVar5 = *pvVar10;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&pg->weight,(long)(int)local_1e8);
            if (*pvVar10 <= iVar5) {
              _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&p_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&q);
              if (_Var4) {
                pvVar9 = std::
                         vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                         ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                       *)local_d8,(long)(int)__range2_1);
                rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (pvVar9,(long)(int)local_1e8);
                local_240 = rVar15;
                std::_Bit_reference::operator=(&local_240,true);
                uVar2 = km._24_8_;
                pvVar13 = std::vector<Node,_std::allocator<Node>_>::operator[]
                                    (&dg->nodes,(long)__range4._4_4_);
                std::__cxx11::string::string(local_260,(string *)pvVar13);
                pvVar13 = std::vector<Node,_std::allocator<Node>_>::operator[]
                                    (&dg->nodes,(long)(int)local_230._0_4_);
                std::__cxx11::string::string(local_280,(string *)pvVar13);
                std::__cxx11::string::string(local_2a0,(string *)&q);
                Graph::insertEdge((Graph *)uVar2,(string *)local_260,(string *)local_280,
                                  (string *)local_2a0);
                std::__cxx11::string::~string(local_2a0);
                std::__cxx11::string::~string(local_280);
                std::__cxx11::string::~string(local_260);
              }
            }
          }
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_230);
          std::
          _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&__end4);
        }
        __range4._4_4_ = __range4._4_4_ + 1;
      }
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_1e8);
      std::
      _Rb_tree_const_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2_1);
    }
    __range2_1._0_4_ = (int)__range2_1 + 1;
  }
  local_2a4 = 0;
  do {
    iVar5 = local_2a4;
    iVar6 = Graph::nodeNum(&pg->super_Graph);
    if (iVar6 <= iVar5) {
      this_local._7_1_ = true;
LAB_0011991f:
      local_2fc = 1;
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 *)local_d8);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_b8);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)
                 &nodeMatch.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage);
      Kmatrix::~Kmatrix((Kmatrix *)local_50);
      return this_local._7_1_;
    }
    rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)local_b8,(long)local_2a4);
    local_2b8 = rVar15;
    bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_2b8);
    if (!bVar3) {
      pvVar13 = std::vector<Node,_std::allocator<Node>_>::operator[]
                          (&(pg->super_Graph).nodes,(long)local_2a4);
      Node::Node((Node *)&j_2,pvVar13);
      poVar14 = operator<<((ostream *)&std::cout,(Node *)&j_2);
      std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
      Node::~Node((Node *)&j_2);
      this_local._7_1_ = false;
      goto LAB_0011991f;
    }
    local_300 = 0;
    while( true ) {
      iVar5 = local_300;
      iVar6 = Graph::nodeNum(&pg->super_Graph);
      if (iVar6 <= iVar5) break;
      pvVar9 = std::
               vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                             *)local_d8,(long)local_2a4);
      rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar9,(long)local_300);
      local_310 = rVar15;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_310);
      if (!bVar3) {
        pvVar13 = std::vector<Node,_std::allocator<Node>_>::operator[]
                            (&(pg->super_Graph).nodes,(long)local_2a4);
        Node::Node(&local_350,pvVar13);
        poVar14 = operator<<((ostream *)&std::cout,&local_350);
        poVar14 = std::operator<<(poVar14," --->>> ");
        pvVar13 = std::vector<Node,_std::allocator<Node>_>::operator[]
                            (&(pg->super_Graph).nodes,(long)local_300);
        Node::Node(&local_390,pvVar13);
        poVar14 = operator<<(poVar14,&local_390);
        std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
        Node::~Node(&local_390);
        Node::~Node(&local_350);
        this_local._7_1_ = false;
        goto LAB_0011991f;
      }
      local_300 = local_300 + 1;
    }
    local_2a4 = local_2a4 + 1;
  } while( true );
}

Assistant:

bool Lmatch::getMatch(Pattern &pg, Graph &dg, Graph &dest) {
    Kmatrix km;

    km.calMatrix(pg, dg, pg.getT());

    set<int> nodes;

    vector<bool> nodeMatch(pg.nodeNum(), false);
    vector<vector<bool>> edgeMatch(pg.nodeNum(), vector<bool>(pg.nodeNum(), true));
    for (int i = 0; i < pg.nodeNum(); i++) {
        for (auto p : pg.edges[i])
            edgeMatch[i][p.first] = false;
    }

    for (int i = 0; i < pg.nodeNum(); i++)
        if (pg.weight[i] == -1)
            pg.weight[i] = pg.getT() + 1;

    for (int i = 0; i < pg.nodeNum(); i++) {
        for (int j = 0; j < dg.nodeNum(); j++) {
            if (km.M[i][j] >= pg.weight[i]) {
                nodeMatch[i] = true;
                nodes.insert(j);
            }
        }
    }

    for (int i : nodes) {
        dest.insertNode(dg.nodes[i]);
    }

    for (int i = 0; i < pg.nodeNum(); i++) {
        for (pair<int, string> p : pg.edges[i]) {
            for (int j = 0; j < dg.nodeNum(); j++) {
                for (pair<int, string> q : dg.edges[j]) {
                    if (km.M[i][j] >= pg.weight[i] && km.M[p.first][q.first] >= pg.weight[p.first]
                            && p.second == q.second) {
                        edgeMatch[i][p.first] = true;
                        dest.insertEdge(dg.nodes[j].id, dg.nodes[q.first].id, q.second);
                    }
                }
            }
        }
    }

    for (int i = 0; i < pg.nodeNum(); i++) {
        if (nodeMatch[i] == false) {
            cout << pg.nodes[i] << endl;
            return false;
        }
        for (int j = 0; j < pg.nodeNum(); j++) {
            if (edgeMatch[i][j] == false) {
                cout << pg.nodes[i] << " --->>> " << pg.nodes[j] << endl;
                return false;
            }
        }
    }
    return true;
}